

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_tests.cpp
# Opt level: O1

void * __thiscall
allocator_tests::TestLockedPageAllocator::AllocateLocked
          (TestLockedPageAllocator *this,size_t len,bool *lockingSuccess)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *lockingSuccess = false;
  if (this->count < 1) {
    pvVar3 = (void *)0x0;
  }
  else {
    iVar2 = this->count + -1;
    this->count = iVar2;
    if (0 < this->lockedcount) {
      this->lockedcount = this->lockedcount + -1;
      *lockingSuccess = true;
    }
    pvVar3 = (void *)((long)(iVar2 * 0x1000000) + 0x8000000);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pvVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* AllocateLocked(size_t len, bool *lockingSuccess) override
    {
        *lockingSuccess = false;
        if (count > 0) {
            --count;

            if (lockedcount > 0) {
                --lockedcount;
                *lockingSuccess = true;
            }

            return reinterpret_cast<void*>(uint64_t{static_cast<uint64_t>(0x08000000) + (count << 24)}); // Fake address, do not actually use this memory
        }
        return nullptr;
    }